

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# galloping_search.hpp
# Opt level: O1

_List_iterator<signed_char>
burst::detail::galloping_search<std::_List_iterator<signed_char>,int,std::less<void>>
          (long *first,long *last,int *value)

{
  long *plVar1;
  _List_iterator<signed_char> _Var2;
  long lVar3;
  long lVar4;
  long lVar5;
  difference_type __d;
  long lVar6;
  
  plVar1 = first;
  if (first != last) {
    do {
      if (*value <= (int)(char)plVar1[2]) break;
      plVar1 = (long *)*plVar1;
    } while (plVar1 != last);
  }
  if (plVar1 != last) {
    plVar1 = (long *)*plVar1;
    if (plVar1 != last) {
      do {
        if ((int)(char)plVar1[2] < *value) break;
        plVar1 = (long *)*plVar1;
      } while (plVar1 != last);
    }
    if (plVar1 != last) {
      __assert_fail("std::is_partitioned(first, last, [& value, & compare] (const auto & e) {return compare(e, value);})"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/algorithm/detail/galloping_search.hpp"
                    ,0x16,
                    "RandomAccessIterator burst::detail::galloping_search(RandomAccessIterator, RandomAccessIterator, const Value &, Compare) [RandomAccessIterator = std::_List_iterator<signed char>, Value = int, Compare = std::less<void>]"
                   );
    }
  }
  lVar5 = 0;
  plVar1 = first;
  if (first != last) {
    do {
      plVar1 = (long *)*plVar1;
      lVar5 = lVar5 + 1;
    } while (plVar1 != last);
  }
  lVar6 = 1;
  lVar4 = 0;
  while( true ) {
    if (lVar5 <= lVar4 + lVar6) {
      _Var2 = std::
              __lower_bound<std::_List_iterator<signed_char>,int,__gnu_cxx::__ops::_Iter_comp_val<std::less<void>>>
                        (first,last,value);
      return (_List_iterator<signed_char>)_Var2._M_node;
    }
    lVar3 = lVar6;
    plVar1 = first;
    if (lVar6 < 1) {
      for (; lVar3 != 0; lVar3 = lVar3 + 1) {
        plVar1 = (long *)plVar1[1];
      }
    }
    else {
      do {
        plVar1 = (long *)*plVar1;
        lVar3 = lVar3 + -1;
      } while (lVar3 != 0);
    }
    if (*value <= (int)(char)plVar1[2]) break;
    first = (long *)*plVar1;
    lVar4 = lVar4 + lVar6 + 1;
    lVar6 = lVar6 * 2;
  }
  _Var2 = std::
          __lower_bound<std::_List_iterator<signed_char>,int,__gnu_cxx::__ops::_Iter_comp_val<std::less<void>>>
                    (first,plVar1,value);
  return (_List_iterator<signed_char>)_Var2._M_node;
}

Assistant:

RandomAccessIterator
            galloping_search
            (
                RandomAccessIterator first, RandomAccessIterator last,
                const Value & value,
                Compare compare
            )
        {
            assert(std::is_partitioned(first, last,
                [& value, & compare] (const auto & e) {return compare(e, value);}));

            const auto distance = std::distance(first, last);

            auto position = static_cast<decltype(distance)>(0);
            auto step = static_cast<decltype(distance)>(1);

            while (position + step < distance)
            {
                const auto current = std::next(first, step);
                if (compare(*current, value))
                {
                    first = std::next(current);
                    position += step + 1;
                    step *= 2;
                }
                else
                {
                    return std::lower_bound(first, current, value, compare);
                }
            }

            return std::lower_bound(first, last, value, compare);
        }